

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O2

void idwt_per_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  iVar1 = (int)((long)lpr_len / 2);
  uVar10 = (len_cA + iVar1) - 1;
  lVar12 = (long)istride;
  lVar8 = (long)len_cA;
  uVar17 = 0;
  uVar2 = (long)lpr_len / 2 & 0xffffffff;
  if (iVar1 < 1) {
    uVar2 = uVar17;
  }
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar17;
  }
  iVar6 = len_cA * istride;
  lVar3 = -(lVar12 * lVar8);
  lVar14 = -1;
  lVar18 = -2;
  do {
    if (uVar17 == uVar11) {
      return;
    }
    lVar18 = lVar18 + 2;
    lVar14 = lVar14 + 2;
    lVar19 = lVar18 * ostride;
    lVar15 = lVar14 * ostride;
    X[lVar19] = 0.0;
    X[lVar15] = 0.0;
    lVar9 = 0;
    lVar4 = lVar3;
    uVar16 = uVar17;
    iVar7 = iVar6;
    for (lVar13 = 0; uVar2 << 4 != lVar13; lVar13 = lVar13 + 0x10) {
      if ((long)uVar16 < lVar8 && -1 < (long)uVar16) {
        lVar5 = (uVar17 - lVar9) * lVar12;
LAB_0010f171:
        X[lVar19] = *(double *)((long)lpr + lVar13) * cA[lVar5] +
                    *(double *)((long)hpr + lVar13) * cD[lVar5] + X[lVar19];
        X[lVar15] = *(double *)((long)lpr + lVar13 + 8) * cA[lVar5] +
                    *(double *)((long)hpr + lVar13 + 8) * cD[lVar5] + X[lVar15];
      }
      else {
        lVar5 = lVar4;
        if ((long)uVar16 < (long)(len_cA + lpr_len + -1) && lVar8 <= (long)uVar16)
        goto LAB_0010f171;
        if (((long)uVar16 < 0) && ((long)-iVar1 < (long)uVar16)) {
          lVar5 = (long)iVar7;
          goto LAB_0010f171;
        }
      }
      lVar9 = lVar9 + 1;
      iVar7 = iVar7 - istride;
      uVar16 = uVar16 - 1;
      lVar4 = lVar4 - lVar12;
    }
    uVar17 = uVar17 + 1;
    iVar6 = iVar6 + istride;
    lVar3 = lVar3 + lVar12;
  } while( true );
}

Assistant:

void idwt_per_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, l2;
	int is, ms, ns;

	len_avg = lpr_len;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				is = (i - l - len_cA) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				is = (len_cA + i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}